

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  service srv;
  service asStack_98 [8];
  undefined1 *local_90;
  undefined8 local_88;
  code *local_80;
  code *local_78;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined1 local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  cppcms::service::service(asStack_98,argc,argv);
  uVar2 = cppcms::service::applications_pool();
  cppcms::create_pool<async_unit_test>();
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/async","");
  cppcms::mount_point::mount_point((mount_point *)&local_90,(string *)local_68);
  cppcms::applications_pool::mount(uVar2,local_28,&local_90,1);
  cppcms::mount_point::~mount_point((mount_point *)&local_90);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  uVar2 = cppcms::service::applications_pool();
  cppcms::create_pool<nonblocking_unit_test>();
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/nonblocking","");
  cppcms::mount_point::mount_point((mount_point *)&local_90,(string *)local_68);
  cppcms::applications_pool::mount(uVar2,local_38,&local_90,1);
  cppcms::mount_point::~mount_point((mount_point *)&local_90);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  uVar2 = cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/sync","");
  cppcms::mount_point::mount_point((mount_point *)&local_90,(string *)local_68);
  cppcms::applications_pool::mount(uVar2,local_48,&local_90,0);
  cppcms::mount_point::~mount_point((mount_point *)&local_90);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  local_88 = 0;
  local_78 = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_80 = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_90 = asStack_98;
  cppcms::service::after_fork((function *)asStack_98);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,3);
  }
  cppcms::service::run();
  cppcms::service::~service(asStack_98);
  if ((bad_count == 4) && (calls == 5)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    iVar1 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed bad_count = ",0x13);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,bad_count);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (exp 4) calls = ",0x11);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,calls);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (exp 5)",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( 
			cppcms::create_pool<async_unit_test>(),
			cppcms::mount_point("/async"),
			cppcms::app::asynchronous);

		srv.applications_pool().mount(
			cppcms::create_pool<nonblocking_unit_test>(),
			cppcms::mount_point("/nonblocking"),
			cppcms::app::asynchronous);

		srv.applications_pool().mount( cppcms::create_pool<unit_test>(), cppcms::mount_point("/sync"));
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	if(bad_count != 4 || calls != 5) {
		std::cerr << "Failed bad_count = " << bad_count << " (exp 4) calls = " << calls << " (exp 5)"<< std::endl;
		return EXIT_FAILURE;
	}
	std::cout << "Ok" << std::endl;
	return EXIT_SUCCESS;
}